

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,float coordX,
               int coordY,Vec4 *result)

{
  int size;
  bool bVar1;
  int iVar2;
  int i;
  int c;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  Vec2 uBounds;
  Vec4 colorA;
  Vec4 colorB;
  Vec2 local_78;
  float local_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  Vec4 local_50;
  tcu local_40 [16];
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,(level->m_size).m_data[0],coordX
             ,(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  fVar3 = floorf(local_70 + -0.5);
  fVar4 = floorf(fStack_6c + -0.5);
  size = (level->m_size).m_data[0];
  getTextureChannelClass((level->m_format).type);
  iVar2 = (int)fVar3;
  do {
    c = iVar2;
    if ((int)fVar4 < c) break;
    iVar2 = TexVerifierUtil::wrap(sampler->wrapS,c,size);
    i = TexVerifierUtil::wrap(sampler->wrapS,c + 1,size);
    fVar3 = (float)c;
    fVar6 = (local_70 + -0.5) - fVar3;
    fVar7 = (fStack_6c + -0.5) - fVar3;
    auVar5._4_4_ = fVar7;
    auVar5._0_4_ = fVar6;
    auVar5._8_4_ = 0.0 - fVar3;
    auVar5._12_4_ = 0.0 - fVar3;
    auVar5 = minps(_DAT_0166f150,auVar5);
    local_68 = (float)(-(uint)(0.0 <= fVar6) & auVar5._0_4_);
    fStack_64 = (float)(-(uint)(0.0 <= fVar7) & auVar5._4_4_);
    uStack_60 = -(uint)(0.0 <= 0.0 - fVar3) & auVar5._8_4_;
    uStack_5c = -(uint)(0.0 <= 0.0 - fVar3) & auVar5._12_4_;
    lookup<float>((tcu *)&local_50,level,sampler,iVar2,coordY,0);
    lookup<float>(local_40,level,sampler,i,coordY,0);
    local_78.m_data[1] = fStack_64;
    local_78.m_data[0] = local_68;
    bVar1 = isLinearRangeValid(prec,&local_50,(Vec4 *)local_40,&local_78,result);
    iVar2 = c + 1;
  } while (!bVar1);
  return c <= (int)fVar4;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const float							coordX,
								const int							coordY,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);

	const int					w				= level.getWidth();

	const TextureFormat			format			= level.getFormat();
	const TextureChannelClass	texClass		= getTextureChannelClass(format.type);

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);
	DE_UNREF(texClass);
	DE_UNREF(format);

	for (int i = minI; i <= maxI; i++)
	{
		// Wrapped coordinates
		const int	x0		= wrap(sampler.wrapS, i  , w);
		const int	x1		= wrap(sampler.wrapS, i+1, w);

		// Bounds for filtering factors
		const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
		const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);

		const Vec4	colorA	= lookup<float>(level, sampler, x0, coordY, 0);
		const Vec4	colorB	= lookup<float>(level, sampler, x1, coordY, 0);

		if (isLinearRangeValid(prec, colorA, colorB, Vec2(minA, maxA), result))
			return true;
	}

	return false;
}